

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void __thiscall Clasp::ClaspStatistics::Impl::visit(Impl *this,StatisticObject *obj,KeySet *visited)

{
  Type TVar1;
  uint32 uVar2;
  iterator iVar3;
  char *k;
  uint32 uVar4;
  __ireturn_type _Var5;
  StatisticObject local_38;
  
  local_38 = (StatisticObject)obj->handle_;
  iVar3 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)this,&local_38.handle_);
  if (iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
    _Var5 = std::__detail::
            _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)visited,
                     (value_type *)
                     ((long)iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur + 8));
    if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      TVar1 = StatisticObject::type(obj);
      if (TVar1.val_ == Array) {
        uVar2 = StatisticObject::size(obj);
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          local_38 = StatisticObject::operator[](obj,uVar4);
          visit(this,&local_38,visited);
        }
      }
      else if (TVar1.val_ == Map) {
        uVar2 = StatisticObject::size(obj);
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          k = StatisticObject::key(obj,uVar4);
          local_38 = StatisticObject::at(obj,k);
          visit(this,&local_38,visited);
        }
      }
    }
  }
  return;
}

Assistant:

void visit(const StatisticObject& obj, KeySet& visited) {
		KeySet::iterator it = objects_.find(obj.toRep());
		if (it == objects_.end() || !visited.insert(*it).second) { return; }
		switch (obj.type()) {
			case Potassco::Statistics_t::Map:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj.at(obj.key(i)), visited); }
				break;
			case Potassco::Statistics_t::Array:
				for (uint32 i = 0, end = obj.size(); i != end; ++i) { visit(obj[i], visited); }
				break;
			default: break;
		}
	}